

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.hpp
# Opt level: O3

string * __thiscall
duckdb::ExtensionHelper::FindExtensionInEntries<8ul>
          (string *__return_storage_ptr__,ExtensionHelper *this,string *name,
          ExtensionEntry (*entries) [8])

{
  int iVar1;
  ExtensionEntry *pEVar2;
  size_t sVar3;
  string lcase;
  string local_40;
  
  StringUtil::Lower(&local_40,(string *)this);
  pEVar2 = ::std::
           __find_if<duckdb::ExtensionEntry_const*,__gnu_cxx::__ops::_Iter_pred<duckdb::ExtensionHelper::FindExtensionInEntries<8ul>(std::__cxx11::string_const&,duckdb::ExtensionEntry_const(&)[8ul])::_lambda(duckdb::ExtensionEntry_const&)_1_>>
                     (name,(ExtensionEntry *)(name + 0x18),&local_40);
  if (pEVar2 != (ExtensionEntry *)(name + 0x18)) {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar3 = strlen(pEVar2->extension);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pEVar2->extension,pEVar2->extension + sVar3);
      goto LAB_004acbc7;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_63f17de + 9);
LAB_004acbc7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string FindExtensionInEntries(const string &name, const ExtensionEntry (&entries)[N]) {
		auto lcase = StringUtil::Lower(name);

		auto it =
		    std::find_if(entries, entries + N, [&](const ExtensionEntry &element) { return element.name == lcase; });

		if (it != entries + N && it->name == lcase) {
			return it->extension;
		}
		return "";
	}